

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeInfo.cpp
# Opt level: O1

bool __thiscall TypeInfo::testInvaild(TypeInfo *this)

{
  XMLCh XVar1;
  XMLCh XVar2;
  wchar16 wVar3;
  wchar16 wVar4;
  long *plVar5;
  long *plVar6;
  wchar16 *pwVar7;
  XMLCh *pXVar8;
  ostream *poVar9;
  char *pcVar10;
  size_t sVar11;
  long lVar12;
  DOMElement *pDVar13;
  short *psVar14;
  long *plVar15;
  XMLCh *pXVar16;
  wchar16 *pwVar17;
  undefined1 uVar18;
  bool bVar19;
  XStr local_90;
  XStr local_88;
  XStr local_80;
  XStr local_78;
  XStr local_70;
  XStr local_68;
  XStr local_60;
  XStr local_58;
  XStr local_50;
  XStr local_48;
  XStr local_40;
  XStr local_38;
  
  plVar5 = (long *)(**(code **)(*(long *)this->doc + 0x68))();
  plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
  pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
  local_90.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("rootType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar19 = true;
  if (pwVar7 != local_90.fUnicodeForm) {
    pwVar17 = local_90.fUnicodeForm;
    if (local_90.fUnicodeForm == (wchar16 *)0x0 || pwVar7 == (wchar16 *)0x0) {
      if (pwVar7 == (wchar16 *)0x0) {
        if (local_90.fUnicodeForm != (wchar16 *)0x0) goto LAB_001207a1;
      }
      else {
        bVar19 = *pwVar7 == L'\0';
        if ((local_90.fUnicodeForm != (wchar16 *)0x0) && (*pwVar7 == L'\0')) {
LAB_001207a1:
          bVar19 = *pwVar17 == L'\0';
        }
      }
    }
    else {
      do {
        wVar3 = *pwVar7;
        if (wVar3 == L'\0') goto LAB_001207a1;
        pwVar7 = pwVar7 + 1;
        wVar4 = *pwVar17;
        pwVar17 = pwVar17 + 1;
      } while (wVar3 == wVar4);
      bVar19 = false;
    }
  }
  if (bVar19) {
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    pXVar8 = (XMLCh *)(**(code **)(*plVar6 + 0x18))(plVar6);
    local_38.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    tmp = true;
    if (pXVar8 != local_38.fUnicodeForm) {
      pXVar16 = local_38.fUnicodeForm;
      if (local_38.fUnicodeForm == (XMLCh *)0x0 || pXVar8 == (XMLCh *)0x0) {
        if (pXVar8 == (XMLCh *)0x0) {
          if (local_38.fUnicodeForm != (XMLCh *)0x0) goto LAB_00120838;
        }
        else {
          tmp = *pXVar8 == L'\0';
          if ((local_38.fUnicodeForm != (XMLCh *)0x0) && (*pXVar8 == L'\0')) {
LAB_00120838:
            tmp = *pXVar16 == L'\0';
          }
        }
      }
      else {
        do {
          XVar1 = *pXVar8;
          if (XVar1 == L'\0') goto LAB_00120838;
          pXVar8 = pXVar8 + 1;
          XVar2 = *pXVar16;
          pXVar16 = pXVar16 + 1;
        } while (XVar1 == XVar2);
        tmp = false;
      }
    }
    if (bVar19) {
      XStr::~XStr(&local_38);
    }
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_90);
  uVar18 = tmp;
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x2a9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    local_90.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("rootType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                (local_90.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    local_80.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                (local_80.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    XStr::~XStr(&local_80);
    XStr::~XStr(&local_90);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    lVar12 = (**(code **)(*plVar6 + 0x10))(plVar6);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00120a14:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00120a14;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    lVar12 = (**(code **)(*plVar6 + 0x18))(plVar6);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00120abc:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar5 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar5 + 0x18))(plVar5);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00120abc;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
  }
  local_90.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("invalidTest",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pDVar13 = findElement(this,local_90.fUnicodeForm);
  XStr::~XStr(&local_90);
  pXVar8 = (XMLCh *)xercesc_4_0::XMLString::transcode
                              ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_90.fUnicodeForm = pXVar8;
  local_80.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("simple",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar5 = (long *)(**(code **)(*(long *)pDVar13 + 0x198))(pDVar13,pXVar8,local_80.fUnicodeForm);
  XStr::~XStr(&local_80);
  XStr::~XStr(&local_90);
  plVar6 = (long *)(**(code **)(*plVar5 + 0x170))(plVar5);
  pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
  local_90.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("stringDerivedType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar19 = true;
  if (pwVar7 != local_90.fUnicodeForm) {
    pwVar17 = local_90.fUnicodeForm;
    if (local_90.fUnicodeForm == (wchar16 *)0x0 || pwVar7 == (wchar16 *)0x0) {
      if (pwVar7 == (wchar16 *)0x0) {
        if (local_90.fUnicodeForm != (wchar16 *)0x0) goto LAB_00120c25;
      }
      else {
        bVar19 = *pwVar7 == L'\0';
        if ((local_90.fUnicodeForm != (wchar16 *)0x0) && (*pwVar7 == L'\0')) {
LAB_00120c25:
          bVar19 = *pwVar17 == L'\0';
        }
      }
    }
    else {
      do {
        wVar3 = *pwVar7;
        if (wVar3 == L'\0') goto LAB_00120c25;
        pwVar7 = pwVar7 + 1;
        wVar4 = *pwVar17;
        pwVar17 = pwVar17 + 1;
      } while (wVar3 == wVar4);
      bVar19 = false;
    }
  }
  if (bVar19) {
    plVar6 = (long *)(**(code **)(*plVar5 + 0x170))(plVar5);
    pXVar8 = (XMLCh *)(**(code **)(*plVar6 + 0x18))(plVar6);
    local_80.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    tmp = true;
    if (pXVar8 != local_80.fUnicodeForm) {
      pXVar16 = local_80.fUnicodeForm;
      if (local_80.fUnicodeForm == (XMLCh *)0x0 || pXVar8 == (XMLCh *)0x0) {
        if (pXVar8 == (XMLCh *)0x0) {
          if (local_80.fUnicodeForm != (XMLCh *)0x0) goto LAB_00120cc4;
        }
        else {
          tmp = *pXVar8 == L'\0';
          if ((local_80.fUnicodeForm != (XMLCh *)0x0) && (*pXVar8 == L'\0')) {
LAB_00120cc4:
            tmp = *pXVar16 == L'\0';
          }
        }
      }
      else {
        do {
          XVar1 = *pXVar8;
          if (XVar1 == L'\0') goto LAB_00120cc4;
          pXVar8 = pXVar8 + 1;
          XVar2 = *pXVar16;
          pXVar16 = pXVar16 + 1;
        } while (XVar1 == XVar2);
        tmp = false;
      }
    }
    if (bVar19) {
      XStr::~XStr(&local_80);
    }
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_90);
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x2af);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    local_90.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("stringDerivedType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                (local_90.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    local_88.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                (local_88.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    XStr::~XStr(&local_88);
    XStr::~XStr(&local_90);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x170))(plVar5);
    lVar12 = (**(code **)(*plVar6 + 0x10))(plVar6);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00120e9b:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar5 + 0x170))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00120e9b;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x170))(plVar5);
    lVar12 = (**(code **)(*plVar6 + 0x18))(plVar6);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00120f41:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar5 = (long *)(**(code **)(*plVar5 + 0x170))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar5 + 0x18))(plVar5);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00120f41;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar18 = 0;
  }
  pXVar8 = (XMLCh *)xercesc_4_0::XMLString::transcode
                              ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_90.fUnicodeForm = pXVar8;
  local_88.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("invalid",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar5 = (long *)(**(code **)(*(long *)pDVar13 + 0x198))(pDVar13,pXVar8,local_88.fUnicodeForm);
  XStr::~XStr(&local_88);
  XStr::~XStr(&local_90);
  plVar6 = (long *)(**(code **)(*plVar5 + 0x170))(plVar5);
  psVar14 = (short *)(**(code **)(*plVar6 + 0x10))(plVar6);
  if ((psVar14 == (short *)0x0) || (*psVar14 == 0)) {
    plVar6 = (long *)(**(code **)(*plVar5 + 0x170))(plVar5);
    psVar14 = (short *)(**(code **)(*plVar6 + 0x18))(plVar6);
    if (psVar14 == (short *)0x0) {
      tmp = true;
    }
    else {
      tmp = *psVar14 == 0;
      if (!tmp) goto LAB_0012104a;
    }
  }
  else {
    tmp = false;
LAB_0012104a:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x2b2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x170))(plVar5);
    lVar12 = (**(code **)(*plVar6 + 0x10))(plVar6);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_001211ab:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar5 + 0x170))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_001211ab;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x170))(plVar5);
    lVar12 = (**(code **)(*plVar6 + 0x18))(plVar6);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0012125d:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar5 = (long *)(**(code **)(*plVar5 + 0x170))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar5 + 0x18))(plVar5);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0012125d;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar18 = 0;
  }
  plVar5 = (long *)(**(code **)(*(long *)pDVar13 + 0x38))(pDVar13);
  plVar5 = (long *)(**(code **)(*plVar5 + 0x50))(plVar5);
  plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
  pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
  local_90.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("stringDerivedType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar19 = true;
  if (pwVar7 != local_90.fUnicodeForm) {
    pwVar17 = local_90.fUnicodeForm;
    if (local_90.fUnicodeForm == (wchar16 *)0x0 || pwVar7 == (wchar16 *)0x0) {
      if (pwVar7 == (wchar16 *)0x0) {
        if (local_90.fUnicodeForm != (wchar16 *)0x0) goto LAB_00121351;
      }
      else {
        bVar19 = *pwVar7 == L'\0';
        if ((local_90.fUnicodeForm != (wchar16 *)0x0) && (*pwVar7 == L'\0')) {
LAB_00121351:
          bVar19 = *pwVar17 == L'\0';
        }
      }
    }
    else {
      do {
        wVar3 = *pwVar7;
        if (wVar3 == L'\0') goto LAB_00121351;
        pwVar7 = pwVar7 + 1;
        wVar4 = *pwVar17;
        pwVar17 = pwVar17 + 1;
      } while (wVar3 == wVar4);
      bVar19 = false;
    }
  }
  if (bVar19) {
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    pXVar8 = (XMLCh *)(**(code **)(*plVar6 + 0x18))(plVar6);
    local_88.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    tmp = true;
    if (pXVar8 != local_88.fUnicodeForm) {
      pXVar16 = local_88.fUnicodeForm;
      if (local_88.fUnicodeForm == (XMLCh *)0x0 || pXVar8 == (XMLCh *)0x0) {
        if (pXVar8 == (XMLCh *)0x0) {
          if (local_88.fUnicodeForm != (XMLCh *)0x0) goto LAB_001213ea;
        }
        else {
          tmp = *pXVar8 == L'\0';
          if ((local_88.fUnicodeForm != (XMLCh *)0x0) && (*pXVar8 == L'\0')) {
LAB_001213ea:
            tmp = *pXVar16 == L'\0';
          }
        }
      }
      else {
        do {
          XVar1 = *pXVar8;
          if (XVar1 == L'\0') goto LAB_001213ea;
          pXVar8 = pXVar8 + 1;
          XVar2 = *pXVar16;
          pXVar16 = pXVar16 + 1;
        } while (XVar1 == XVar2);
        tmp = false;
      }
    }
    if (bVar19) {
      XStr::~XStr(&local_88);
    }
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_90);
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x2b5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    local_90.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("stringDerivedType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                (local_90.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    local_48.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                (local_48.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    XStr::~XStr(&local_48);
    XStr::~XStr(&local_90);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    lVar12 = (**(code **)(*plVar6 + 0x10))(plVar6);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_001215c1:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_001215c1;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    lVar12 = (**(code **)(*plVar6 + 0x18))(plVar6);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00121667:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00121667;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar18 = 0;
  }
  plVar5 = (long *)(**(code **)(*plVar5 + 0x50))(plVar5);
  plVar5 = (long *)(**(code **)(*plVar5 + 0x50))(plVar5);
  plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
  pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
  local_90.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("baseComplex",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar19 = true;
  if (pwVar7 != local_90.fUnicodeForm) {
    pwVar17 = local_90.fUnicodeForm;
    if (local_90.fUnicodeForm == (wchar16 *)0x0 || pwVar7 == (wchar16 *)0x0) {
      if (pwVar7 == (wchar16 *)0x0) {
        if (local_90.fUnicodeForm != (wchar16 *)0x0) goto LAB_0012175b;
      }
      else {
        bVar19 = *pwVar7 == L'\0';
        if ((local_90.fUnicodeForm != (wchar16 *)0x0) && (*pwVar7 == L'\0')) {
LAB_0012175b:
          bVar19 = *pwVar17 == L'\0';
        }
      }
    }
    else {
      do {
        wVar3 = *pwVar7;
        if (wVar3 == L'\0') goto LAB_0012175b;
        pwVar7 = pwVar7 + 1;
        wVar4 = *pwVar17;
        pwVar17 = pwVar17 + 1;
      } while (wVar3 == wVar4);
      bVar19 = false;
    }
  }
  if (bVar19) {
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
    local_48.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    tmp = true;
    if (pwVar7 != local_48.fUnicodeForm) {
      pwVar17 = local_48.fUnicodeForm;
      if (local_48.fUnicodeForm == (wchar16 *)0x0 || pwVar7 == (wchar16 *)0x0) {
        if (pwVar7 == (wchar16 *)0x0) {
          if (local_48.fUnicodeForm != (wchar16 *)0x0) goto LAB_001217f4;
        }
        else {
          tmp = *pwVar7 == L'\0';
          if ((local_48.fUnicodeForm != (wchar16 *)0x0) && (*pwVar7 == L'\0')) {
LAB_001217f4:
            tmp = *pwVar17 == L'\0';
          }
        }
      }
      else {
        do {
          wVar3 = *pwVar7;
          if (wVar3 == L'\0') goto LAB_001217f4;
          pwVar7 = pwVar7 + 1;
          wVar4 = *pwVar17;
          pwVar17 = pwVar17 + 1;
        } while (wVar3 == wVar4);
        tmp = false;
      }
    }
    if (bVar19) {
      XStr::~XStr(&local_48);
    }
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_90);
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x2b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    local_90.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("baseComplex",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                (local_90.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    local_50.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                (local_50.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    XStr::~XStr(&local_50);
    XStr::~XStr(&local_90);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    lVar12 = (**(code **)(*plVar6 + 0x10))(plVar6);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_001219cb:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_001219cb;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    lVar12 = (**(code **)(*plVar6 + 0x18))(plVar6);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00121a71:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00121a71;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar18 = 0;
  }
  plVar5 = (long *)(**(code **)(*plVar5 + 0x50))(plVar5);
  plVar5 = (long *)(**(code **)(*plVar5 + 0x50))(plVar5);
  plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
  pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
  local_90.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("stringDerivedType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar19 = true;
  if (pwVar7 != local_90.fUnicodeForm) {
    pwVar17 = local_90.fUnicodeForm;
    if (local_90.fUnicodeForm == (wchar16 *)0x0 || pwVar7 == (wchar16 *)0x0) {
      if (pwVar7 == (wchar16 *)0x0) {
        if (local_90.fUnicodeForm != (wchar16 *)0x0) goto LAB_00121b65;
      }
      else {
        bVar19 = *pwVar7 == L'\0';
        if ((local_90.fUnicodeForm != (wchar16 *)0x0) && (*pwVar7 == L'\0')) {
LAB_00121b65:
          bVar19 = *pwVar17 == L'\0';
        }
      }
    }
    else {
      do {
        wVar3 = *pwVar7;
        if (wVar3 == L'\0') goto LAB_00121b65;
        pwVar7 = pwVar7 + 1;
        wVar4 = *pwVar17;
        pwVar17 = pwVar17 + 1;
      } while (wVar3 == wVar4);
      bVar19 = false;
    }
  }
  if (bVar19) {
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
    local_50.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    tmp = true;
    if (pwVar7 != local_50.fUnicodeForm) {
      pwVar17 = local_50.fUnicodeForm;
      if (local_50.fUnicodeForm == (wchar16 *)0x0 || pwVar7 == (wchar16 *)0x0) {
        if (pwVar7 == (wchar16 *)0x0) {
          if (local_50.fUnicodeForm != (wchar16 *)0x0) goto LAB_00121bfe;
        }
        else {
          tmp = *pwVar7 == L'\0';
          if ((local_50.fUnicodeForm != (wchar16 *)0x0) && (*pwVar7 == L'\0')) {
LAB_00121bfe:
            tmp = *pwVar17 == L'\0';
          }
        }
      }
      else {
        do {
          wVar3 = *pwVar7;
          if (wVar3 == L'\0') goto LAB_00121bfe;
          pwVar7 = pwVar7 + 1;
          wVar4 = *pwVar17;
          pwVar17 = pwVar17 + 1;
        } while (wVar3 == wVar4);
        tmp = false;
      }
    }
    if (bVar19) {
      XStr::~XStr(&local_50);
    }
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_90);
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,700);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    local_90.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("stringDerivedType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                (local_90.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    local_58.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                (local_58.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    XStr::~XStr(&local_58);
    XStr::~XStr(&local_90);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    lVar12 = (**(code **)(*plVar6 + 0x10))(plVar6);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00121dd5:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00121dd5;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    lVar12 = (**(code **)(*plVar6 + 0x18))(plVar6);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00121e7b:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00121e7b;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar18 = 0;
  }
  plVar5 = (long *)(**(code **)(*plVar5 + 0x50))(plVar5);
  plVar5 = (long *)(**(code **)(*plVar5 + 0x50))(plVar5);
  plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
  pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
  local_90.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("baseComplex",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar19 = true;
  if (pwVar7 != local_90.fUnicodeForm) {
    pwVar17 = local_90.fUnicodeForm;
    if (local_90.fUnicodeForm == (wchar16 *)0x0 || pwVar7 == (wchar16 *)0x0) {
      if (pwVar7 == (wchar16 *)0x0) {
        if (local_90.fUnicodeForm != (wchar16 *)0x0) goto LAB_00121f6f;
      }
      else {
        bVar19 = *pwVar7 == L'\0';
        if ((local_90.fUnicodeForm != (wchar16 *)0x0) && (*pwVar7 == L'\0')) {
LAB_00121f6f:
          bVar19 = *pwVar17 == L'\0';
        }
      }
    }
    else {
      do {
        wVar3 = *pwVar7;
        if (wVar3 == L'\0') goto LAB_00121f6f;
        pwVar7 = pwVar7 + 1;
        wVar4 = *pwVar17;
        pwVar17 = pwVar17 + 1;
      } while (wVar3 == wVar4);
      bVar19 = false;
    }
  }
  if (bVar19) {
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
    local_58.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    tmp = true;
    if (pwVar7 != local_58.fUnicodeForm) {
      pwVar17 = local_58.fUnicodeForm;
      if (local_58.fUnicodeForm == (wchar16 *)0x0 || pwVar7 == (wchar16 *)0x0) {
        if (pwVar7 == (wchar16 *)0x0) {
          if (local_58.fUnicodeForm != (wchar16 *)0x0) goto LAB_00122008;
        }
        else {
          tmp = *pwVar7 == L'\0';
          if ((local_58.fUnicodeForm != (wchar16 *)0x0) && (*pwVar7 == L'\0')) {
LAB_00122008:
            tmp = *pwVar17 == L'\0';
          }
        }
      }
      else {
        do {
          wVar3 = *pwVar7;
          if (wVar3 == L'\0') goto LAB_00122008;
          pwVar7 = pwVar7 + 1;
          wVar4 = *pwVar17;
          pwVar17 = pwVar17 + 1;
        } while (wVar3 == wVar4);
        tmp = false;
      }
    }
    if (bVar19) {
      XStr::~XStr(&local_58);
    }
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_90);
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x2bf);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    local_90.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("baseComplex",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                (local_90.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    local_60.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                (local_60.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    XStr::~XStr(&local_60);
    XStr::~XStr(&local_90);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    lVar12 = (**(code **)(*plVar6 + 0x10))(plVar6);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_001221df:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_001221df;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    lVar12 = (**(code **)(*plVar6 + 0x18))(plVar6);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00122285:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00122285;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar18 = 0;
  }
  plVar5 = (long *)(**(code **)(*plVar5 + 0x50))(plVar5);
  plVar5 = (long *)(**(code **)(*plVar5 + 0x50))(plVar5);
  plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
  pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
  local_90.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("uType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar19 = true;
  if (pwVar7 != local_90.fUnicodeForm) {
    pwVar17 = local_90.fUnicodeForm;
    if (local_90.fUnicodeForm == (wchar16 *)0x0 || pwVar7 == (wchar16 *)0x0) {
      if (pwVar7 == (wchar16 *)0x0) {
        if (local_90.fUnicodeForm != (wchar16 *)0x0) goto LAB_00122379;
      }
      else {
        bVar19 = *pwVar7 == L'\0';
        if ((local_90.fUnicodeForm != (wchar16 *)0x0) && (*pwVar7 == L'\0')) {
LAB_00122379:
          bVar19 = *pwVar17 == L'\0';
        }
      }
    }
    else {
      do {
        wVar3 = *pwVar7;
        if (wVar3 == L'\0') goto LAB_00122379;
        pwVar7 = pwVar7 + 1;
        wVar4 = *pwVar17;
        pwVar17 = pwVar17 + 1;
      } while (wVar3 == wVar4);
      bVar19 = false;
    }
  }
  if (bVar19) {
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
    local_60.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    tmp = true;
    if (pwVar7 != local_60.fUnicodeForm) {
      pwVar17 = local_60.fUnicodeForm;
      if (local_60.fUnicodeForm == (wchar16 *)0x0 || pwVar7 == (wchar16 *)0x0) {
        if (pwVar7 == (wchar16 *)0x0) {
          if (local_60.fUnicodeForm != (wchar16 *)0x0) goto LAB_00122412;
        }
        else {
          tmp = *pwVar7 == L'\0';
          if ((local_60.fUnicodeForm != (wchar16 *)0x0) && (*pwVar7 == L'\0')) {
LAB_00122412:
            tmp = *pwVar17 == L'\0';
          }
        }
      }
      else {
        do {
          wVar3 = *pwVar7;
          if (wVar3 == L'\0') goto LAB_00122412;
          pwVar7 = pwVar7 + 1;
          wVar4 = *pwVar17;
          pwVar17 = pwVar17 + 1;
        } while (wVar3 == wVar4);
        tmp = false;
      }
    }
    if (bVar19) {
      XStr::~XStr(&local_60);
    }
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_90);
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x2c2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    local_90.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("uType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                (local_90.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    local_68.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                (local_68.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    XStr::~XStr(&local_68);
    XStr::~XStr(&local_90);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    lVar12 = (**(code **)(*plVar6 + 0x10))(plVar6);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_001225e9:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_001225e9;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    lVar12 = (**(code **)(*plVar6 + 0x18))(plVar6);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0012268f:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0012268f;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar18 = 0;
  }
  plVar5 = (long *)(**(code **)(*plVar5 + 0x50))(plVar5);
  plVar5 = (long *)(**(code **)(*plVar5 + 0x50))(plVar5);
  plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
  psVar14 = (short *)(**(code **)(*plVar6 + 0x10))(plVar6);
  if ((psVar14 == (short *)0x0) || (*psVar14 == 0)) {
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    psVar14 = (short *)(**(code **)(*plVar6 + 0x18))(plVar6);
    if (psVar14 == (short *)0x0) {
      tmp = true;
    }
    else {
      tmp = *psVar14 == 0;
      if (!tmp) goto LAB_00122757;
    }
  }
  else {
    tmp = false;
LAB_00122757:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x2c5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    lVar12 = (**(code **)(*plVar6 + 0x10))(plVar6);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_001228b8:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_001228b8;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    lVar12 = (**(code **)(*plVar6 + 0x18))(plVar6);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0012296a:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0012296a;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar18 = 0;
  }
  plVar6 = (long *)(**(code **)(*plVar5 + 0x38))(plVar5);
  plVar6 = (long *)(**(code **)(*plVar6 + 0x50))(plVar6);
  plVar15 = (long *)(**(code **)(*plVar6 + 0x1d8))(plVar6);
  psVar14 = (short *)(**(code **)(*plVar15 + 0x10))(plVar15);
  if ((psVar14 == (short *)0x0) || (*psVar14 == 0)) {
    plVar15 = (long *)(**(code **)(*plVar6 + 0x1d8))(plVar6);
    psVar14 = (short *)(**(code **)(*plVar15 + 0x18))(plVar15);
    if (psVar14 == (short *)0x0) {
      tmp = true;
    }
    else {
      tmp = *psVar14 == 0;
      if (!tmp) goto LAB_00122a32;
    }
  }
  else {
    tmp = false;
LAB_00122a32:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x2c8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar15 = (long *)(**(code **)(*plVar6 + 0x1d8))(plVar6);
    lVar12 = (**(code **)(*plVar15 + 0x10))(plVar15);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00122b93:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar15 = (long *)(**(code **)(*plVar6 + 0x1d8))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar15 + 0x10))(plVar15);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00122b93;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar15 = (long *)(**(code **)(*plVar6 + 0x1d8))(plVar6);
    lVar12 = (**(code **)(*plVar15 + 0x18))(plVar15);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00122c45:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 0x1d8))(plVar6);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00122c45;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar18 = 0;
  }
  plVar5 = (long *)(**(code **)(*plVar5 + 0x50))(plVar5);
  plVar5 = (long *)(**(code **)(*plVar5 + 0x50))(plVar5);
  plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
  pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
  local_90.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("attrOnlyType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar19 = true;
  if (pwVar7 != local_90.fUnicodeForm) {
    pwVar17 = local_90.fUnicodeForm;
    if (local_90.fUnicodeForm == (wchar16 *)0x0 || pwVar7 == (wchar16 *)0x0) {
      if (pwVar7 == (wchar16 *)0x0) {
        if (local_90.fUnicodeForm != (wchar16 *)0x0) goto LAB_00122d39;
      }
      else {
        bVar19 = *pwVar7 == L'\0';
        if ((local_90.fUnicodeForm != (wchar16 *)0x0) && (*pwVar7 == L'\0')) {
LAB_00122d39:
          bVar19 = *pwVar17 == L'\0';
        }
      }
    }
    else {
      do {
        wVar3 = *pwVar7;
        if (wVar3 == L'\0') goto LAB_00122d39;
        pwVar7 = pwVar7 + 1;
        wVar4 = *pwVar17;
        pwVar17 = pwVar17 + 1;
      } while (wVar3 == wVar4);
      bVar19 = false;
    }
  }
  if (bVar19) {
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
    local_68.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    tmp = true;
    if (pwVar7 != local_68.fUnicodeForm) {
      pwVar17 = local_68.fUnicodeForm;
      if (local_68.fUnicodeForm == (wchar16 *)0x0 || pwVar7 == (wchar16 *)0x0) {
        if (pwVar7 == (wchar16 *)0x0) {
          if (local_68.fUnicodeForm != (wchar16 *)0x0) goto LAB_00122dd2;
        }
        else {
          tmp = *pwVar7 == L'\0';
          if ((local_68.fUnicodeForm != (wchar16 *)0x0) && (*pwVar7 == L'\0')) {
LAB_00122dd2:
            tmp = *pwVar17 == L'\0';
          }
        }
      }
      else {
        do {
          wVar3 = *pwVar7;
          if (wVar3 == L'\0') goto LAB_00122dd2;
          pwVar7 = pwVar7 + 1;
          wVar4 = *pwVar17;
          pwVar17 = pwVar17 + 1;
        } while (wVar3 == wVar4);
        tmp = false;
      }
    }
    if (bVar19) {
      XStr::~XStr(&local_68);
    }
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_90);
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x2cb);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    local_90.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("attrOnlyType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                (local_90.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    local_70.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                (local_70.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    XStr::~XStr(&local_70);
    XStr::~XStr(&local_90);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    lVar12 = (**(code **)(*plVar6 + 0x10))(plVar6);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00122fa9:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00122fa9;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    lVar12 = (**(code **)(*plVar6 + 0x18))(plVar6);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_0012304f:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_0012304f;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar18 = 0;
  }
  plVar5 = (long *)(**(code **)(*plVar5 + 0x50))(plVar5);
  plVar5 = (long *)(**(code **)(*plVar5 + 0x50))(plVar5);
  plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
  pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
  local_90.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("attrOnlyType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar19 = true;
  if (pwVar7 != local_90.fUnicodeForm) {
    pwVar17 = local_90.fUnicodeForm;
    if (local_90.fUnicodeForm == (wchar16 *)0x0 || pwVar7 == (wchar16 *)0x0) {
      if (pwVar7 == (wchar16 *)0x0) {
        if (local_90.fUnicodeForm != (wchar16 *)0x0) goto LAB_00123143;
      }
      else {
        bVar19 = *pwVar7 == L'\0';
        if ((local_90.fUnicodeForm != (wchar16 *)0x0) && (*pwVar7 == L'\0')) {
LAB_00123143:
          bVar19 = *pwVar17 == L'\0';
        }
      }
    }
    else {
      do {
        wVar3 = *pwVar7;
        if (wVar3 == L'\0') goto LAB_00123143;
        pwVar7 = pwVar7 + 1;
        wVar4 = *pwVar17;
        pwVar17 = pwVar17 + 1;
      } while (wVar3 == wVar4);
      bVar19 = false;
    }
  }
  if (bVar19) {
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
    local_70.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    tmp = true;
    if (pwVar7 != local_70.fUnicodeForm) {
      pwVar17 = local_70.fUnicodeForm;
      if (local_70.fUnicodeForm == (wchar16 *)0x0 || pwVar7 == (wchar16 *)0x0) {
        if (pwVar7 == (wchar16 *)0x0) {
          if (local_70.fUnicodeForm != (wchar16 *)0x0) goto LAB_001231dc;
        }
        else {
          tmp = *pwVar7 == L'\0';
          if ((local_70.fUnicodeForm != (wchar16 *)0x0) && (*pwVar7 == L'\0')) {
LAB_001231dc:
            tmp = *pwVar17 == L'\0';
          }
        }
      }
      else {
        do {
          wVar3 = *pwVar7;
          if (wVar3 == L'\0') goto LAB_001231dc;
          pwVar7 = pwVar7 + 1;
          wVar4 = *pwVar17;
          pwVar17 = pwVar17 + 1;
        } while (wVar3 == wVar4);
        tmp = false;
      }
    }
    if (bVar19) {
      XStr::~XStr(&local_70);
    }
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_90);
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x2ce);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nExpected values : typename \'",0x1d);
    local_90.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("attrOnlyType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                (local_90.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
    local_78.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                (local_78.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    XStr::~XStr(&local_78);
    XStr::~XStr(&local_90);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    lVar12 = (**(code **)(*plVar6 + 0x10))(plVar6);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_001233b3:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_001233b3;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    lVar12 = (**(code **)(*plVar6 + 0x18))(plVar6);
    if (lVar12 == 0) {
      pcVar10 = "(null)";
      sVar11 = 6;
LAB_00123459:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
      pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
      pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar10 != (char *)0x0) {
        sVar11 = strlen(pcVar10);
        goto LAB_00123459;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar18 = 0;
  }
  plVar5 = (long *)(**(code **)(*plVar5 + 0x50))(plVar5);
  plVar5 = (long *)(**(code **)(*plVar5 + 0x50))(plVar5);
  plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
  pXVar8 = (XMLCh *)(**(code **)(*plVar6 + 0x10))(plVar6);
  local_90.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("prohibitedAttrType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar19 = true;
  if (pXVar8 != local_90.fUnicodeForm) {
    pXVar16 = local_90.fUnicodeForm;
    if (local_90.fUnicodeForm == (XMLCh *)0x0 || pXVar8 == (XMLCh *)0x0) {
      if (pXVar8 == (XMLCh *)0x0) {
        if (local_90.fUnicodeForm != (XMLCh *)0x0) goto LAB_0012354d;
      }
      else {
        bVar19 = *pXVar8 == L'\0';
        if ((local_90.fUnicodeForm != (XMLCh *)0x0) && (*pXVar8 == L'\0')) {
LAB_0012354d:
          bVar19 = *pXVar16 == L'\0';
        }
      }
    }
    else {
      do {
        XVar1 = *pXVar8;
        if (XVar1 == L'\0') goto LAB_0012354d;
        pXVar8 = pXVar8 + 1;
        XVar2 = *pXVar16;
        pXVar16 = pXVar16 + 1;
      } while (XVar1 == XVar2);
      bVar19 = false;
    }
  }
  if (bVar19) {
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
    local_78.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    tmp = true;
    if (pwVar7 != local_78.fUnicodeForm) {
      pwVar17 = local_78.fUnicodeForm;
      if (local_78.fUnicodeForm == (wchar16 *)0x0 || pwVar7 == (wchar16 *)0x0) {
        if (pwVar7 == (wchar16 *)0x0) {
          if (local_78.fUnicodeForm != (wchar16 *)0x0) goto LAB_001235e6;
        }
        else {
          tmp = *pwVar7 == L'\0';
          if ((local_78.fUnicodeForm != (wchar16 *)0x0) && (*pwVar7 == L'\0')) {
LAB_001235e6:
            tmp = *pwVar17 == L'\0';
          }
        }
      }
      else {
        do {
          wVar3 = *pwVar7;
          if (wVar3 == L'\0') goto LAB_001235e6;
          pwVar7 = pwVar7 + 1;
          wVar4 = *pwVar17;
          pwVar17 = pwVar17 + 1;
        } while (wVar3 == wVar4);
        tmp = false;
      }
    }
    if (bVar19) {
      XStr::~XStr(&local_78);
    }
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_90);
  if (tmp != false) {
    return (bool)uVar18;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x2d1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\nExpected values : typename \'",0x1d);
  local_90.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("prohibitedAttrType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                              (local_90.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager)
  ;
  if (pcVar10 == (char *)0x0) {
    std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
  }
  else {
    sVar11 = strlen(pcVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\', uri \'",8);
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager)
  ;
  pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                              (local_40.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager)
  ;
  if (pcVar10 == (char *)0x0) {
    std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
  }
  else {
    sVar11 = strlen(pcVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
  }
  XStr::~XStr(&local_40);
  XStr::~XStr(&local_90);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
  plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
  lVar12 = (**(code **)(*plVar6 + 0x10))(plVar6);
  if (lVar12 == 0) {
    pcVar10 = "(null)";
    sVar11 = 6;
LAB_001237bd:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
  }
  else {
    plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    pwVar7 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 != (char *)0x0) {
      sVar11 = strlen(pcVar10);
      goto LAB_001237bd;
    }
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
  plVar6 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
  lVar12 = (**(code **)(*plVar6 + 0x18))(plVar6);
  if (lVar12 == 0) {
    pcVar10 = "(null)";
    sVar11 = 6;
  }
  else {
    plVar5 = (long *)(**(code **)(*plVar5 + 0x1d8))(plVar5);
    pwVar7 = (wchar16 *)(**(code **)(*plVar5 + 0x18))(plVar5);
    pcVar10 = (char *)xercesc_4_0::XMLString::transcode
                                (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
      goto LAB_00123881;
    }
    sVar11 = strlen(pcVar10);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar10,sVar11);
LAB_00123881:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  return false;
}

Assistant:

bool TypeInfo::testInvaild() {

    bool passed = true;
    DOMNode *docEle = doc->getDocumentElement();
    UNUSED(docEle); // silence warning
    DOMAttr *testAttr;


    DOMTYPEINFOTEST(((DOMElement *)docEle)->getSchemaTypeInfo(), X("rootType"), X(""), __LINE__);

    //element invalidTest
    DOMElement *testEle = findElement(X("invalidTest"));

    testAttr = testEle->getAttributeNodeNS(X(""), X("simple"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), X("stringDerivedType"), X(""), __LINE__);

    testAttr = testEle->getAttributeNodeNS(X(""), X("invalid"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), 0, 0, __LINE__);

    testEle = (DOMElement *)testEle->getFirstChild()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("stringDerivedType"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("baseComplex"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    // this is a "number" of type "base" but it has a xsi:type="stringDerivedType"
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("stringDerivedType"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("baseComplex"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("uType"), X(""), __LINE__);
    //an undeclared element does not have anon value. Test this here
    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), 0, 0, __LINE__);

    DOMElement *testEle2 = (DOMElement *)testEle->getFirstChild()->getNextSibling();
    DOMTYPEINFOTEST(testEle2->getSchemaTypeInfo(), 0, 0, __LINE__);
    
    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("attrOnlyType"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("attrOnlyType"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("prohibitedAttrType"), X(""), __LINE__);

    return passed;
}